

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_parser_t * mpc_check(mpc_parser_t *a,mpc_dtor_t da,mpc_check_t f,char *e)

{
  mpc_parser_t *pmVar1;
  size_t sVar2;
  void *pvVar3;
  char *in_RCX;
  void *in_RDX;
  void *in_RSI;
  char *in_RDI;
  mpc_parser_t *p;
  
  pmVar1 = mpc_undefined();
  pmVar1->type = '\x19';
  (pmVar1->data).fail.m = in_RDI;
  (pmVar1->data).lift.x = in_RSI;
  (pmVar1->data).apply_to.d = in_RDX;
  sVar2 = strlen(in_RCX);
  pvVar3 = malloc(sVar2 + 1);
  (pmVar1->data).check_with.d = pvVar3;
  strcpy((pmVar1->data).check.e,in_RCX);
  return pmVar1;
}

Assistant:

mpc_parser_t *mpc_check(mpc_parser_t *a, mpc_dtor_t da, mpc_check_t f, const char *e) {
  mpc_parser_t  *p = mpc_undefined();
  p->type = MPC_TYPE_CHECK;
  p->data.check.x = a;
  p->data.check.dx = da;
  p->data.check.f = f;
  p->data.check.e = malloc(strlen(e) + 1);
  strcpy(p->data.check.e, e);
  return p;
}